

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.cpp
# Opt level: O0

Block * __thiscall Block::CalculateBlockHash_abi_cxx11_(Block *this)

{
  void *this_00;
  ostream *poVar1;
  string *in_RSI;
  string local_1d0 [48];
  stringstream local_1a0 [8];
  stringstream ss;
  undefined1 local_190 [384];
  Block *this_local;
  
  this_local = this;
  std::__cxx11::stringstream::stringstream(local_1a0);
  this_00 = (void *)std::ostream::operator<<(local_190,*(uint *)(in_RSI + 0x90));
  poVar1 = (ostream *)std::ostream::operator<<(this_00,*(long *)(in_RSI + 0x88));
  poVar1 = std::operator<<(poVar1,in_RSI + 0x68);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(long *)(in_RSI + 0x60));
  poVar1 = std::operator<<(poVar1,in_RSI);
  std::operator<<(poVar1,in_RSI + 0x40);
  std::__cxx11::stringstream::str();
  sha256(&this->bPrevHash);
  std::__cxx11::string::~string(local_1d0);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return this;
}

Assistant:

string Block::CalculateBlockHash()
{
	stringstream ss;
	ss<< _bIndex << _cTime << _bData << _bNonce << bPrevHash << merkle_root;
	return sha256(ss.str());

}